

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O2

void __thiscall json::JsonParseException::~JsonParseException(JsonParseException *this)

{
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

JsonParseException(std::string errorText) : errorText(errorText) {}